

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

uint ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits
               (ON_Font *font,ON__UINT32 unicode_code_point,
               ON_TextBox *glyph_metrics_in_font_design_units)

{
  ON_2dex OVar1;
  ON_2dex OVar2;
  ON_2dex OVar3;
  uint uVar4;
  ON_FontGlyph g;
  ON_FontGlyph OStack_68;
  
  ON_FontGlyph::ON_FontGlyph(&OStack_68,font,unicode_code_point);
  if ((ON_Font::Internal_CustomGetGlyphMetricsFunc != (ON_GetGlyphMetricsFuncType)0x0) &&
     (uVar4 = (*ON_Font::Internal_CustomGetGlyphMetricsFunc)
                        (&OStack_68,glyph_metrics_in_font_design_units), uVar4 != 0)) {
    return uVar4;
  }
  OVar3 = ON_TextBox::Unset.m_advance;
  OVar2 = ON_TextBox::Unset.m_bbmax;
  OVar1 = ON_TextBox::Unset.m_bbmin;
  glyph_metrics_in_font_design_units->m_max_basepoint = ON_TextBox::Unset.m_max_basepoint;
  glyph_metrics_in_font_design_units->m_advance = OVar3;
  glyph_metrics_in_font_design_units->m_bbmin = OVar1;
  glyph_metrics_in_font_design_units->m_bbmax = OVar2;
  return 0;
}

Assistant:

unsigned int ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits(
  const class ON_Font* font,
  ON__UINT32 unicode_code_point,
  class ON_TextBox& glyph_metrics_in_font_design_units
)
{
  unsigned int glyph_index = 0;

  const ON_FontGlyph g(font, unicode_code_point);

  if (nullptr != ON_Font::Internal_CustomGetGlyphMetricsFunc)
  {
    glyph_index = ON_Font::Internal_CustomGetGlyphMetricsFunc(&g, glyph_metrics_in_font_design_units);
    if (0 != glyph_index)
      return glyph_index;
  }

#if defined(ON_OS_WINDOWS_GDI)
  glyph_index = ON_WindowsDWriteGetGlyphMetrics(&g, glyph_metrics_in_font_design_units);
#elif defined(ON_RUNTIME_APPLE_CORE_TEXT_AVAILABLE)
  glyph_index = ON_AppleFontGetGlyphMetrics(&g, glyph_metrics_in_font_design_units);
#elif defined(OPENNURBS_FREETYPE_SUPPORT)
  // Look in opennurbs_system_rumtime.h for the correct place to define OPENNURBS_FREETYPE_SUPPORT.
  // Do NOT define OPENNURBS_FREETYPE_SUPPORT here or in your project setting ("makefile").
  glyph_index = ON_FreeTypeGetGlyphMetrics(&g, glyph_metrics_in_font_design_units);
#endif

  if (0 != glyph_index)
    return glyph_index;

  glyph_metrics_in_font_design_units = ON_TextBox::Unset;
  return 0;
}